

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall sznet::net::Connector::start(Connector *this)

{
  EventLoop *this_00;
  Connector *local_60;
  code *local_58;
  undefined8 local_50;
  type local_48;
  Functor local_30;
  Connector *local_10;
  Connector *this_local;
  
  this->m_connect = true;
  this_00 = this->m_loop;
  local_58 = startInLoop;
  local_50 = 0;
  local_60 = this;
  local_10 = this;
  std::bind<void(sznet::net::Connector::*)(),sznet::net::Connector*>
            (&local_48,(offset_in_Connector_to_subr *)&local_58,&local_60);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::Connector::*(sznet::net::Connector*))()>,void>
            ((function<void()> *)&local_30,&local_48);
  EventLoop::runInLoop(this_00,&local_30);
  std::function<void_()>::~function(&local_30);
  return;
}

Assistant:

void Connector::start()
{
	m_connect = true;
	// FIXME: unsafe
	m_loop->runInLoop(std::bind(&Connector::startInLoop, this));
}